

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlsearch.c
# Opt level: O3

SXML_CHAR * XMLSearch_get_XPath_string(XMLSearch *search,SXML_CHAR **xpath,SXML_CHAR quote)

{
  int iVar1;
  bool bVar2;
  SXML_CHAR *pSVar3;
  char *src2;
  byte bVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  _XMLSearch *p_Var8;
  SXML_CHAR squote [2];
  ushort local_3a;
  SXML_CHAR **local_38;
  
  local_3a = 0x27;
  if (xpath == (SXML_CHAR **)0x0) {
LAB_00106c0c:
    pSVar3 = (SXML_CHAR *)0x0;
  }
  else if (search == (XMLSearch *)0x0) {
    pSVar3 = strdup("");
    *xpath = pSVar3;
  }
  else {
    bVar4 = 0x22;
    if (quote != '\0') {
      bVar4 = quote;
    }
    local_3a = (ushort)bVar4;
    p_Var8 = search;
    do {
      if ((p_Var8 != search) && (pSVar3 = strcat_alloc(xpath,"/"), pSVar3 == (SXML_CHAR *)0x0)) {
LAB_00106bfd:
        free(*xpath);
        *xpath = (SXML_CHAR *)0x0;
        goto LAB_00106c0c;
      }
      pcVar6 = p_Var8->tag;
      src2 = "*";
      if ((pcVar6 != (char *)0x0) && (src2 = pcVar6, *pcVar6 == '\0')) {
        src2 = "*";
      }
      pSVar3 = strcat_alloc(xpath,src2);
      if (pSVar3 == (SXML_CHAR *)0x0) goto LAB_00106bfd;
      if ((p_Var8->n_attributes < 1) && ((p_Var8->text == (char *)0x0 || (*p_Var8->text == '\0'))))
      {
        local_38 = &p_Var8->text;
        bVar2 = true;
      }
      else {
        pSVar3 = strcat_alloc(xpath,"[");
        if (pSVar3 == (SXML_CHAR *)0x0) goto LAB_00106bfd;
        local_38 = &p_Var8->text;
        bVar2 = true;
        if ((p_Var8->text != (char *)0x0) && (*p_Var8->text != '\0')) {
          pSVar3 = strcat_alloc(xpath,".=");
          if ((pSVar3 == (SXML_CHAR *)0x0) ||
             (((pSVar3 = strcat_alloc(xpath,(SXML_CHAR *)&local_3a), pSVar3 == (SXML_CHAR *)0x0 ||
               (pSVar3 = strcat_alloc(xpath,*local_38), pSVar3 == (SXML_CHAR *)0x0)) ||
              (pSVar3 = strcat_alloc(xpath,(SXML_CHAR *)&local_3a), pSVar3 == (SXML_CHAR *)0x0))))
          goto LAB_00106bfd;
          bVar2 = false;
        }
      }
      if (p_Var8->n_attributes < 1) {
        pcVar6 = *local_38;
        if (pcVar6 != (char *)0x0) {
          bVar2 = false;
          goto LAB_00106bce;
        }
      }
      else {
        lVar5 = 0;
        lVar7 = 0;
        do {
          if (((!bVar2) && (pSVar3 = strcat_alloc(xpath,", "), pSVar3 == (SXML_CHAR *)0x0)) ||
             ((pSVar3 = strcat_alloc(xpath,"@"), pSVar3 == (SXML_CHAR *)0x0 ||
              (pSVar3 = strcat_alloc(xpath,*(SXML_CHAR **)((long)&p_Var8->attributes->name + lVar5))
              , pSVar3 == (SXML_CHAR *)0x0)))) goto LAB_00106bfd;
          if (*(long *)((long)&p_Var8->attributes->value + lVar5) != 0) {
            pcVar6 = "=";
            if (*(int *)((long)&p_Var8->attributes->active + lVar5) == 0) {
              pcVar6 = "!=";
            }
            pSVar3 = strcat_alloc(xpath,pcVar6);
            if (((pSVar3 == (SXML_CHAR *)0x0) ||
                (pSVar3 = strcat_alloc(xpath,(SXML_CHAR *)&local_3a), pSVar3 == (SXML_CHAR *)0x0))
               || ((pSVar3 = strcat_alloc(xpath,*(SXML_CHAR **)
                                                 ((long)&p_Var8->attributes->value + lVar5)),
                   pSVar3 == (SXML_CHAR *)0x0 ||
                   (pSVar3 = strcat_alloc(xpath,(SXML_CHAR *)&local_3a), pSVar3 == (SXML_CHAR *)0x0)
                   ))) goto LAB_00106bfd;
          }
          lVar7 = lVar7 + 1;
          iVar1 = p_Var8->n_attributes;
          lVar5 = lVar5 + 0x18;
          bVar2 = false;
        } while (lVar7 < iVar1);
        bVar2 = 0 < iVar1;
        pcVar6 = *local_38;
        if (pcVar6 == (char *)0x0) {
          if (iVar1 < 1) goto LAB_00106beb;
        }
        else {
LAB_00106bce:
          if ((!bVar2) && (*pcVar6 == '\0')) goto LAB_00106beb;
        }
        pSVar3 = strcat_alloc(xpath,"]");
        if (pSVar3 == (SXML_CHAR *)0x0) goto LAB_00106bfd;
      }
LAB_00106beb:
      p_Var8 = p_Var8->next;
    } while (p_Var8 != (_XMLSearch *)0x0);
    pSVar3 = *xpath;
  }
  return pSVar3;
}

Assistant:

SXML_CHAR* XMLSearch_get_XPath_string(const XMLSearch* search, SXML_CHAR** xpath, SXML_CHAR quote)
{
	const XMLSearch* s;
	SXML_CHAR squote[] = C2SX("'");
	int i, fill;

	if (xpath == NULL)
		return NULL;

	/* NULL 'search' is an empty string */
	if (search == NULL) {
		*xpath = sx_strdup(C2SX(""));
		if (*xpath == NULL)
			return NULL;

		return *xpath;
	}

	squote[0] = (quote == NULC ? XML_DEFAULT_QUOTE : quote);

	for (s = search; s != NULL; s = s->next) {
		if (s != search && strcat_alloc(xpath, C2SX("/")) == NULL) goto err; /* No "/" prefix for the first criteria */
		if (strcat_alloc(xpath, s->tag == NULL || s->tag[0] == NULC ? C2SX("*"): s->tag) == NULL) goto err;

		if (s->n_attributes > 0 || (s->text != NULL && s->text[0] != NULC))
			if (strcat_alloc(xpath, C2SX("[")) == NULL) goto err;

		fill = FALSE; /* '[' has not been filled with text yet, no ", " separator should be added */
		if (s->text != NULL && s->text[0] != NULC) {
			if (strcat_alloc(xpath, C2SX(".=")) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
			if (strcat_alloc(xpath, s->text) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
			fill = TRUE;
		}

		for (i = 0; i < s->n_attributes; i++) {
			if (fill) {
				if (strcat_alloc(xpath, C2SX(", ")) == NULL) goto err;
			} else
				fill = TRUE; /* filling is being performed */
			if (strcat_alloc(xpath, C2SX("@")) == NULL) goto err;
			if (strcat_alloc(xpath, s->attributes[i].name) == NULL) goto err;
			if (s->attributes[i].value == NULL) continue;

			if (strcat_alloc(xpath, s->attributes[i].active ? C2SX("=") : C2SX("!=")) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
			if (strcat_alloc(xpath, s->attributes[i].value) == NULL) goto err;
			if (strcat_alloc(xpath, squote) == NULL) goto err;
		}
		if ((s->text != NULL && s->text[0] != NULC) || s->n_attributes > 0) {
			if (strcat_alloc(xpath, C2SX("]")) == NULL) goto err;
		}
	}

	return *xpath;

err:
	__free(*xpath);
	*xpath = NULL;

	return NULL;
}